

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::embedLabelDelta
          (BaseBuilder *this,Label *label,Label *base,size_t dataSize)

{
  bool bVar1;
  BaseBuilder *in_RCX;
  EmbedLabelDeltaNode **in_RDX;
  BaseBuilder *in_RSI;
  long in_RDI;
  Error _err;
  EmbedLabelDeltaNode *node;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Error in_stack_ffffffffffffffbc;
  BaseEmitter *in_stack_ffffffffffffffc0;
  Error local_14;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    local_14 = DebugUtils::errored(5);
  }
  else {
    bVar1 = BaseBuilder_checkDataSize((size_t)in_RCX);
    if (bVar1) {
      local_14 = _newNodeT<asmjit::v1_14::EmbedLabelDeltaNode,unsigned_int,unsigned_int,unsigned_int>
                           (in_RSI,in_RDX,(uint *)in_RCX,(uint *)in_stack_ffffffffffffffc0,
                            (uint *)CONCAT44(in_stack_ffffffffffffffbc,
                                             *(undefined4 *)
                                              ((long)&(in_RSI->super_BaseEmitter)._vptr_BaseEmitter
                                              + 4)));
      if (local_14 == 0) {
        addNode(in_RCX,(BaseNode *)in_stack_ffffffffffffffc0);
        local_14 = 0;
      }
    }
    else {
      DebugUtils::errored(2);
      local_14 = BaseEmitter::reportError
                           (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                            (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
  }
  return local_14;
}

Assistant:

Error BaseBuilder::embedLabelDelta(const Label& label, const Label& base, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!BaseBuilder_checkDataSize(dataSize))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  EmbedLabelDeltaNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedLabelDeltaNode>(&node, label.id(), base.id(), uint32_t(dataSize)));

  addNode(node);
  return kErrorOk;
}